

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

void __thiscall cmCTestSVN::InfoParser::~InfoParser(InfoParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__InfoParser_00bd9bb0;
  pcVar2 = (this->RegexRoot).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pcVar2 = (this->RegexURL).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pcVar2 = (this->RegexRev).program;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00bdd8c8;
  pcVar3 = (this->super_LineParser).Line._M_dataplus._M_p;
  paVar1 = &(this->super_LineParser).Line.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x6e0);
  return;
}

Assistant:

InfoParser(cmCTestSVN* svn, const char* prefix, std::string& rev,
             SVNInfo& svninfo)
    : Rev(rev)
    , SVNRepo(svninfo)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexRev.compile("^Revision: ([0-9]+)");
    this->RegexURL.compile("^URL: +([^ ]+) *$");
    this->RegexRoot.compile("^Repository Root: +([^ ]+) *$");
  }